

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O0

void __thiscall Inferences::URResolution::detach(URResolution *this)

{
  QuestionAnsweringMode QVar1;
  InferenceEngine *in_RDI;
  IndexType in_stack_0000003c;
  IndexManager *in_stack_00000040;
  
  in_RDI[1]._salg = (SaturationAlgorithm *)0x0;
  in_RDI[2]._vptr_InferenceEngine = (_func_int **)0x0;
  QVar1 = Shell::Options::questionAnswering(Lib::env);
  if (QVar1 == SYNTHESIS) {
    Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x83d485);
    Indexing::IndexManager::release(in_stack_00000040,in_stack_0000003c);
    Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x83d4a0);
    Indexing::IndexManager::release(in_stack_00000040,in_stack_0000003c);
  }
  else {
    Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x83d4bd);
    Indexing::IndexManager::release(in_stack_00000040,in_stack_0000003c);
    Saturation::SaturationAlgorithm::getIndexManager((SaturationAlgorithm *)0x83d4d8);
    Indexing::IndexManager::release(in_stack_00000040,in_stack_0000003c);
  }
  InferenceEngine::detach(in_RDI);
  return;
}

Assistant:

void URResolution::detach()
{
  _unitIndex = 0;
  _nonUnitIndex = 0;
  if (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS) {
    _salg->getIndexManager()->release(URR_UNIT_CLAUSE_WITH_AL_SUBST_TREE);
    _salg->getIndexManager()->release(URR_NON_UNIT_CLAUSE_WITH_AL_SUBST_TREE);
  } else {
    _salg->getIndexManager()->release(URR_UNIT_CLAUSE_SUBST_TREE);
    _salg->getIndexManager()->release(URR_NON_UNIT_CLAUSE_SUBST_TREE);
  }
  GeneratingInferenceEngine::detach();
}